

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsettings.cpp
# Opt level: O2

void __thiscall QSettings::beginWriteArray(QSettings *this,QAnyStringView prefix,int size)

{
  QSettingsPrivate *this_00;
  long in_FS_OFFSET;
  QAnyStringView key;
  QArrayDataPointer<char16_t> local_70;
  QSettingsGroup local_58;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = (QSettingsPrivate *)(this->super_QObject).d_ptr.d;
  QSettingsPrivate::normalizedKey((QString *)&local_70,prefix);
  QSettingsGroup::QSettingsGroup(&local_58,(QString *)&local_70,SUB41((uint)size >> 0x1f,0));
  QSettingsPrivate::beginGroupOrArray(this_00,&local_58);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_58);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_70);
  if (size < 0) {
    remove(this,"size");
  }
  else {
    ::QVariant::QVariant((QVariant *)&local_58,size);
    key.m_size = 0x4000000000000004;
    key.field_0.m_data_utf8 = "size";
    setValue(this,key,(QVariant *)&local_58);
    ::QVariant::~QVariant((QVariant *)&local_58);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QSettings::beginWriteArray(QAnyStringView prefix, int size)
{
    Q_D(QSettings);
    d->beginGroupOrArray(QSettingsGroup(d->normalizedKey(prefix), size < 0));

    if (size < 0)
        remove("size"_L1);
    else
        setValue("size"_L1, size);
}